

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O2

void __thiscall
jessilib::io::formatted_message::formatted_message<jessilib::io::text&>
          (formatted_message *this,u8string *in_format,text *args)

{
  initializer_list<jessilib::io::text> __l;
  allocator_type local_41;
  text local_40;
  
  std::__cxx11::u8string::u8string(&this->m_format,in_format);
  text::text(&local_40,args);
  __l._M_len = 1;
  __l._M_array = &local_40;
  std::vector<jessilib::io::text,_std::allocator<jessilib::io::text>_>::vector
            (&this->m_message,__l,&local_41);
  std::__cxx11::u8string::~u8string((u8string *)&local_40);
  return;
}

Assistant:

formatted_message(std::u8string in_format, Args&& ... args)
		: m_format{ std::move(in_format) },
		m_message{ std::forward<Args>(args)... } {
		// Empty ctor body
	}